

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

void __thiscall despot::SemiChainBelief::Update(SemiChainBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = (ulong)((uint)(obs == 0) != action);
  lVar1 = *(long *)&(this->alpha_).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[action].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  *(double *)(lVar1 + uVar2 * 8) = *(double *)(lVar1 + uVar2 * 8) + 1.0;
  this->cur_state_ = (int)obs;
  return;
}

Assistant:

void SemiChainBelief::Update(ACT_TYPE action, OBS_TYPE obs) {
	int next_state = obs;

	int status =
		((action == Chain::ACTION_B && obs == 0)
			|| (action == Chain::ACTION_A && obs != 0)) ? SUCCESS : SLIP;
	alpha_[action][status]++;

	cur_state_ = next_state;
}